

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prov_security_factory.c
# Opt level: O2

int prov_dev_set_symmetric_key_info(char *registration_name,char *symmetric_key)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  char *temp_name;
  char *temp_key;
  
  if (registration_name == (char *)0x0 || symmetric_key == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/prov_security_factory.c"
                ,"prov_dev_set_symmetric_key_info",0x7b,1,
                "Invalid parameter specified reg_name: %p, symm_key: %p",registration_name,
                symmetric_key);
      return 0x7c;
    }
    return 0x7c;
  }
  iVar1 = mallocAndStrcpy_s(&temp_name,registration_name);
  if (iVar1 == 0) {
    iVar1 = mallocAndStrcpy_s(&temp_key,symmetric_key);
    if (iVar1 != 0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/prov_security_factory.c"
                  ,"prov_dev_set_symmetric_key_info",0x89,1,"Failure allocating symmetric key");
      }
      free(temp_name);
      return 0x8b;
    }
    free(g_symm_key);
    free(g_symm_key_reg_name);
    g_symm_key_reg_name = temp_name;
    g_symm_key = temp_key;
    pcVar4 = iothub_security_get_symmetric_key();
    if (((pcVar4 != (char *)0x0) &&
        (pcVar4 = iothub_security_get_symm_registration_name(), pcVar4 != (char *)0x0)) ||
       (iVar1 = iothub_security_set_symmetric_key_info(g_symm_key_reg_name,g_symm_key), iVar1 == 0))
    {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xa0;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xa0;
    }
    pcVar4 = "Failure syncing dps & IoThub key information";
    iVar3 = 0x9f;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x85;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x85;
    }
    pcVar4 = "Failure allocating registration name";
    iVar3 = 0x84;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/prov_security_factory.c"
            ,"prov_dev_set_symmetric_key_info",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

int prov_dev_set_symmetric_key_info(const char* registration_name, const char* symmetric_key)
{
    int result;
    if (registration_name == NULL || symmetric_key == NULL)
    {
        LogError("Invalid parameter specified reg_name: %p, symm_key: %p", registration_name, symmetric_key);
        result = MU_FAILURE;
    }
    else
    {
        char* temp_key;
        char* temp_name;
        if (mallocAndStrcpy_s(&temp_name, registration_name) != 0)
        {
            LogError("Failure allocating registration name");
            result = MU_FAILURE;
        }
        else if (mallocAndStrcpy_s(&temp_key, symmetric_key) != 0)
        {
            LogError("Failure allocating symmetric key");
            free(temp_name);
            result = MU_FAILURE;
        }
        else
        {
            if (g_symm_key != NULL)
            {
                free(g_symm_key);
            }
            if (g_symm_key_reg_name != NULL)
            {
                free(g_symm_key_reg_name);
            }
            g_symm_key_reg_name = temp_name;
            g_symm_key = temp_key;

            // Sync dps with iothub only if it is NULL
            if (iothub_security_get_symmetric_key() == NULL || iothub_security_get_symm_registration_name() == NULL)
            {
                if (iothub_security_set_symmetric_key_info(g_symm_key_reg_name, g_symm_key) != 0)
                {
                    LogError("Failure syncing dps & IoThub key information");
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }
            }
            else
            {
                result = 0;
            }
        }
    }
    return result;
}